

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O2

void __thiscall
Js::JavascriptCopyOnAccessNativeIntArray::MarshalToScriptContext
          (JavascriptCopyOnAccessNativeIntArray *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((((this->super_JavascriptNativeIntArray).super_JavascriptNativeArray.super_JavascriptArray.
          super_ArrayObject.super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary)
       .ptr)->super_JavascriptLibraryBase).scriptContext.ptr == scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.h"
                                ,0x48b,"(this->GetScriptContext() != scriptContext)",
                                "this->GetScriptContext() != scriptContext");
    if (!bVar2) goto LAB_00a69196;
    *puVar3 = 0;
  }
  if (*(long *)&(this->super_JavascriptNativeIntArray).super_JavascriptNativeArray.
                super_JavascriptArray.super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject !=
      VirtualTableInfo<Js::JavascriptCopyOnAccessNativeIntArray>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.h"
                                ,0x48b,
                                "(VirtualTableInfo<JavascriptCopyOnAccessNativeIntArray>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal to script context");
    if (!bVar2) {
LAB_00a69196:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_JavascriptNativeIntArray).super_JavascriptNativeArray.super_JavascriptArray.
  super_ArrayObject.super_DynamicObject.super_RecyclableObject.super_FinalizableObject =
       (FinalizableObject)
       VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptCopyOnAccessNativeIntArray>_>::Address;
  return;
}

Assistant:

JavascriptCopyOnAccessNativeIntArray(uint32 length, DynamicType * type) :
            JavascriptNativeIntArray(length, type) {}